

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

sunrealtype N_VMin_Serial(N_Vector x)

{
  double dVar1;
  sunrealtype *psVar2;
  long lVar3;
  sunrealtype sVar4;
  
  psVar2 = *(sunrealtype **)((long)x->content + 0x10);
  sVar4 = *psVar2;
  for (lVar3 = 1; lVar3 < *x->content; lVar3 = lVar3 + 1) {
    dVar1 = psVar2[lVar3];
    if (sVar4 <= dVar1) {
      dVar1 = sVar4;
    }
    sVar4 = dVar1;
  }
  return sVar4;
}

Assistant:

sunrealtype N_VMin_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype min, *xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  min = xd[0];

  for (i = 1; i < N; i++)
  {
    if (xd[i] < min) { min = xd[i]; }
  }

  return (min);
}